

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkmanagerservice.cpp
# Opt level: O3

optional<QDBusInterface> *
getPrimaryDevice(optional<QDBusInterface> *__return_storage_ptr__,QDBusObjectPath *devicePath)

{
  QArrayData *pQVar1;
  char cVar2;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QDBusConnection local_c0 [8];
  QString local_b8;
  QString local_a0;
  QArrayDataPointer<QDBusObjectPath> local_88;
  undefined8 local_68;
  undefined8 uStack_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  optional<QDBusInterface> *local_30;
  
  local_30 = *(optional<QDBusInterface> **)(in_FS_OFFSET + 0x28);
  local_68 = 0xaaaaaaaaaaaaaaaa;
  uStack_60 = 0xaaaaaaaaaaaaaaaa;
  QVar3.m_data = (storage_type *)0x1e;
  QVar3.m_size = (qsizetype)&local_58;
  QString::fromLatin1(QVar3);
  local_88.d = (Data *)local_58.shared;
  local_88.ptr = (QDBusObjectPath *)local_58._8_8_;
  local_88.size = local_58._16_8_;
  local_a0.d.d = (devicePath->m_path).d.d;
  local_a0.d.ptr = (devicePath->m_path).d.ptr;
  local_a0.d.size = (devicePath->m_path).d.size;
  if (&(local_a0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_a0.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_a0.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QVar4.m_data = (storage_type *)0x30;
  QVar4.m_size = (qsizetype)&local_58;
  QString::fromLatin1(QVar4);
  local_b8.d.d = (Data *)local_58.shared;
  local_b8.d.ptr = (char16_t *)local_58._8_8_;
  local_b8.d.size = local_58._16_8_;
  QDBusConnection::systemBus();
  QDBusInterface::QDBusInterface
            ((QDBusInterface *)&local_68,(QString *)&local_88,&local_a0,&local_b8,
             (QDBusConnection *)local_58.data,(QObject *)0x0);
  QDBusConnection::~QDBusConnection((QDBusConnection *)local_58.data);
  if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a0.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_88.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d)->super_QArrayData,2,0x10);
    }
  }
  cVar2 = QDBusAbstractInterface::isValid();
  if (cVar2 == '\0') {
    (__return_storage_ptr__->super__Optional_base<QDBusInterface,_false,_false>)._M_payload.
    super__Optional_payload<QDBusInterface,_true,_false,_false>.
    super__Optional_payload_base<QDBusInterface>._M_engaged = false;
  }
  else {
    local_88.size = -0x5555555555555556;
    local_88.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_88.ptr = (QDBusObjectPath *)0xaaaaaaaaaaaaaaaa;
    QObject::property((char *)local_58.data);
    qvariant_cast<QList<QDBusObjectPath>>((QList<QDBusObjectPath> *)&local_88,(QVariant *)&local_58)
    ;
    QVariant::~QVariant((QVariant *)&local_58);
    if (local_88.size == 0) {
      (__return_storage_ptr__->super__Optional_base<QDBusInterface,_false,_false>)._M_payload.
      super__Optional_payload<QDBusInterface,_true,_false,_false>.
      super__Optional_payload_base<QDBusInterface>._M_engaged = false;
    }
    else {
      pQVar1 = &(((local_88.ptr)->m_path).d.d)->super_QArrayData;
      local_58._8_8_ = ((local_88.ptr)->m_path).d.ptr;
      local_58._16_8_ = ((local_88.ptr)->m_path).d.size;
      if (pQVar1 == (QArrayData *)0x0) {
        local_58.shared = (PrivateShared *)0x0;
      }
      else {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        local_58.shared = (PrivateShared *)pQVar1;
      }
      local_a0.d.ptr = L"org.freedesktop.NetworkManager";
      local_a0.d.d = (Data *)0x1e;
      local_b8.d.d = (Data *)0x25;
      local_b8.d.ptr = L"org.freedesktop.NetworkManager.Device";
      QDBusConnection::systemBus();
      std::_Optional_payload_base<QDBusInterface>::_Storage<QDBusInterface,false>::
      _Storage<QLatin1String,QString,QLatin1String,QDBusConnection>
                ((_Storage<QDBusInterface,false> *)__return_storage_ptr__,&local_a0,&local_58,
                 &local_b8,local_c0);
      (__return_storage_ptr__->super__Optional_base<QDBusInterface,_false,_false>)._M_payload.
      super__Optional_payload<QDBusInterface,_true,_false,_false>.
      super__Optional_payload_base<QDBusInterface>._M_engaged = true;
      QDBusConnection::~QDBusConnection(local_c0);
      if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_58.shared = *(int *)local_58.shared + -1;
        UNLOCK();
        if (*(int *)local_58.shared == 0) {
          QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
        }
      }
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,2,0x10);
        }
      }
    }
    QArrayDataPointer<QDBusObjectPath>::~QArrayDataPointer(&local_88);
  }
  QDBusInterface::~QDBusInterface((QDBusInterface *)&local_68);
  if (*(optional<QDBusInterface> **)(in_FS_OFFSET + 0x28) == local_30) {
    return *(optional<QDBusInterface> **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static std::optional<QDBusInterface> getPrimaryDevice(const QDBusObjectPath &devicePath)
{
    const QDBusInterface connection(NM_DBUS_SERVICE, devicePath.path(),
                                    NM_CONNECTION_DBUS_INTERFACE, QDBusConnection::systemBus());
    if (!connection.isValid())
        return std::nullopt;

    const auto devicePaths = connection.property("Devices").value<QList<QDBusObjectPath>>();
    if (devicePaths.isEmpty())
        return std::nullopt;

    const QDBusObjectPath primaryDevicePath = devicePaths.front();
    return std::make_optional<QDBusInterface>(NM_DBUS_SERVICE, primaryDevicePath.path(),
                                              NM_DEVICE_DBUS_INTERFACE,
                                              QDBusConnection::systemBus());
}